

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void I210ToARGBRow_C(uint16_t *src_y,uint16_t *src_u,uint16_t *src_v,uint8_t *rgb_buf,
                    YuvConstants *yuvconstants,int width)

{
  long lVar1;
  
  for (lVar1 = 0; (int)lVar1 < width + -1; lVar1 = lVar1 + 2) {
    libyuv::YuvPixel10(src_y[lVar1],*(uint16_t *)((long)src_u + lVar1),
                       *(uint16_t *)((long)src_v + lVar1),rgb_buf,rgb_buf + 1,rgb_buf + 2,
                       yuvconstants);
    rgb_buf[3] = 0xff;
    libyuv::YuvPixel10(src_y[lVar1 + 1],*(uint16_t *)((long)src_u + lVar1),
                       *(uint16_t *)((long)src_v + lVar1),rgb_buf + 4,rgb_buf + 5,rgb_buf + 6,
                       yuvconstants);
    rgb_buf[7] = 0xff;
    rgb_buf = rgb_buf + 8;
  }
  if ((width & 1U) != 0) {
    libyuv::YuvPixel10(src_y[lVar1],*(uint16_t *)((long)src_u + lVar1),
                       *(uint16_t *)((long)src_v + lVar1),rgb_buf,rgb_buf + 1,rgb_buf + 2,
                       yuvconstants);
    rgb_buf[3] = 0xff;
  }
  return;
}

Assistant:

void I210ToARGBRow_C(const uint16_t* src_y,
                     const uint16_t* src_u,
                     const uint16_t* src_v,
                     uint8_t* rgb_buf,
                     const struct YuvConstants* yuvconstants,
                     int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel10(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
               rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
    YuvPixel10(src_y[1], src_u[0], src_v[0], rgb_buf + 4, rgb_buf + 5,
               rgb_buf + 6, yuvconstants);
    rgb_buf[7] = 255;
    src_y += 2;
    src_u += 1;
    src_v += 1;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel10(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
               rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
  }
}